

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::MultiVertexArrayObjectTest::logVertexArrayState
          (MultiVertexArrayObjectTest *this,TestLog *log,VertexArrayState *state,string *msg)

{
  ostringstream *this_00;
  char *pcVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  stringstream message;
  long *local_358;
  long local_350;
  long local_348 [2];
  stringstream local_338 [16];
  undefined1 local_328 [376];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_338);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_328,(msg->_M_dataplus)._M_p,msg->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_328,"GL_ELEMENT_ARRAY_BUFFER : ",0x1a);
  poVar2 = (ostream *)std::ostream::operator<<(local_328,state->elementArrayBuffer);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (0 < (int)((ulong)((long)(state->attributes).
                              super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(state->attributes).
                             super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 2) * 0x38e38e39) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"attribute : ",0xc);
      poVar2 = (ostream *)std::ostream::operator<<(local_328,(int)lVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_ENABLED : ",0x22);
      bVar5 = (&((state->attributes).
                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                 ._M_impl.super__Vector_impl_data._M_start)->enabled)[lVar4] == '\0';
      pcVar1 = "mapped_ == GL_TRUE";
      if (bVar5) {
        pcVar1 = "mapped_ == GL_FALSE";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar1 + 0xb,(ulong)bVar5 + 7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_SIZE : ",0x1f);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,*(int *)((long)&((state->attributes).
                                                  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->size +
                                         lVar4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_STRIDE : ",0x21);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,*(int *)((long)&((state->attributes).
                                                  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->stride
                                         + lVar4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_TYPE : ",0x1f);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_NORMALIZED : ",0x25);
      bVar5 = (&((state->attributes).
                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                 ._M_impl.super__Vector_impl_data._M_start)->normalized)[lVar4] == '\0';
      pcVar1 = "mapped_ == GL_TRUE";
      if (bVar5) {
        pcVar1 = "mapped_ == GL_FALSE";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar1 + 0xb,(ulong)bVar5 + 7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_INTEGER : ",0x22);
      bVar5 = (&((state->attributes).
                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                 ._M_impl.super__Vector_impl_data._M_start)->integer)[lVar4] == '\0';
      pcVar1 = "mapped_ == GL_TRUE";
      if (bVar5) {
        pcVar1 = "mapped_ == GL_FALSE";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar1 + 0xb,(ulong)bVar5 + 7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_DIVISOR : ",0x22);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,*(int *)((long)&((state->attributes).
                                                  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 divisor + lVar4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"\tGL_VERTEX_ATTRIB_ARRAY_POINTER : ",0x22);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,*(int *)((long)&((state->attributes).
                                                  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->offset
                                         + lVar4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"\t GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING : ",0x2a);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x24;
    } while (lVar3 < (int)((ulong)((long)(state->attributes).
                                         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(state->attributes).
                                        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                     0x38e38e39);
  }
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)local_358,local_350)
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_358 != local_348) {
    operator_delete(local_358,local_348[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::stringstream::~stringstream(local_338);
  std::ios_base::~ios_base((ios_base *)(local_328 + 0x70));
  return;
}

Assistant:

void MultiVertexArrayObjectTest::logVertexArrayState (tcu::TestLog& log, const VertexArrayState& state, const std::string& msg)
{
	std::stringstream message;

	message << msg << "\n";
	message << "GL_ELEMENT_ARRAY_BUFFER : " << state.elementArrayBuffer << "\n";

	for (int attribNdx = 0; attribNdx < (int)state.attributes.size(); attribNdx++)
	{
		message
		<< "attribute : " << attribNdx << "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_ENABLED : " << (state.attributes[attribNdx].enabled ? "GL_TRUE" : "GL_FALSE") <<  "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_SIZE : " << state.attributes[attribNdx].size <<  "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_STRIDE : " << state.attributes[attribNdx].stride <<  "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_TYPE : " << state.attributes[attribNdx].type <<  "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_NORMALIZED : " << (state.attributes[attribNdx].normalized ? "GL_TRUE" : "GL_FALSE") <<  "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_INTEGER : " << (state.attributes[attribNdx].integer ? "GL_TRUE" : "GL_FALSE") <<  "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_DIVISOR : " << state.attributes[attribNdx].divisor <<  "\n"
		<< "\tGL_VERTEX_ATTRIB_ARRAY_POINTER : " << state.attributes[attribNdx].offset <<  "\n"
		<< "\t GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING : " << m_buffers[state.attributes[attribNdx].bufferNdx] <<  "\n";
	}
	log << tcu::TestLog::Message << message.str() << tcu::TestLog::EndMessage;
}